

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O2

void __thiscall
t_javame_generator::generate_java_struct_definition
          (t_javame_generator *this,ostream *out,t_struct *tstruct,bool is_exception,bool in_class,
          bool is_result)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  iterator iVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  t_type *ptVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  pointer pptVar7;
  t_field *ptVar8;
  byte bVar9;
  char *pcVar10;
  string field_name;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x22])();
  std::__cxx11::string::string((string *)&field_name,"final",(allocator *)&local_110);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(tstruct->super_t_type).annotations_._M_t,&field_name);
  std::__cxx11::string::~string((string *)&field_name);
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"public ");
  pcVar10 = "final ";
  if ((_Rb_tree_header *)iVar4._M_node ==
      &(tstruct->super_t_type).annotations_._M_t._M_impl.super__Rb_tree_header) {
    pcVar10 = "";
  }
  poVar5 = std::operator<<(poVar5,pcVar10);
  pcVar10 = "static ";
  if (!in_class) {
    pcVar10 = "";
  }
  poVar5 = std::operator<<(poVar5,pcVar10);
  poVar5 = std::operator<<(poVar5,"class ");
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var,iVar3));
  std::operator<<(poVar5," ");
  if (is_exception) {
    std::operator<<(out,"extends Exception ");
  }
  std::operator<<(out,"implements TBase ");
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  generate_struct_desc(this,out,tstruct);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  generate_field_descs(this,out,tstruct);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  for (pptVar7 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar7 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar7 = pptVar7 + 1) {
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::operator<<(poVar5,"private ");
    declare_field_abi_cxx11_(&field_name,this,*pptVar7,false);
    poVar5 = std::operator<<(out,(string *)&field_name);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&field_name);
  }
  if (pptVar7 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"// isset id assignments");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    iVar3 = 0;
    for (pptVar7 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar7 !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar7 = pptVar7 + 1) {
      bVar2 = type_can_be_null(this,(*pptVar7)->type_);
      if (!bVar2) {
        poVar5 = t_generator::indent((t_generator *)this,out);
        poVar5 = std::operator<<(poVar5,"private static final int ");
        isset_field_id_abi_cxx11_(&field_name,this,*pptVar7);
        poVar5 = std::operator<<(poVar5,(string *)&field_name);
        poVar5 = std::operator<<(poVar5," = ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
        poVar5 = std::operator<<(poVar5,";");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&field_name);
        iVar3 = iVar3 + 1;
      }
    }
    if (0 < iVar3) {
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,"private boolean[] __isset_vector = new boolean[");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
      poVar5 = std::operator<<(poVar5,"];");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    }
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
  }
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"public ");
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_00,iVar3));
  poVar5 = std::operator<<(poVar5,"() {");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  bVar9 = 1;
  for (pptVar7 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar7 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar7 = pptVar7 + 1) {
    ptVar6 = t_type::get_true_type((*pptVar7)->type_);
    ptVar8 = *pptVar7;
    if (ptVar8->value_ != (t_const_value *)0x0) {
      std::operator+(&local_50,"this.",&ptVar8->name_);
      print_const_value(this,out,&local_50,ptVar6,(*pptVar7)->value_,true,true);
      std::__cxx11::string::~string((string *)&local_50);
      ptVar8 = *pptVar7;
    }
    bVar9 = bVar9 & ptVar8->req_ == T_OPTIONAL;
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  if (!(bool)((tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start ==
              (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_finish | bVar9)) {
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"public ");
    iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_01,iVar3));
    poVar5 = std::operator<<(poVar5,"(");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    bVar2 = true;
    for (pptVar7 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar7 !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar7 = pptVar7 + 1) {
      if ((*pptVar7)->req_ != T_OPTIONAL) {
        if (!bVar2) {
          poVar5 = std::operator<<(out,",");
          std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        }
        poVar5 = t_generator::indent((t_generator *)this,out);
        type_name_abi_cxx11_(&field_name,this,(*pptVar7)->type_,false,false,false);
        poVar5 = std::operator<<(poVar5,(string *)&field_name);
        poVar5 = std::operator<<(poVar5," ");
        std::operator<<(poVar5,(string *)&(*pptVar7)->name_);
        std::__cxx11::string::~string((string *)&field_name);
        bVar2 = false;
      }
    }
    poVar5 = std::operator<<(out,")");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"{");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"this();");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    for (pptVar7 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar7 !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar7 = pptVar7 + 1) {
      if ((*pptVar7)->req_ != T_OPTIONAL) {
        poVar5 = t_generator::indent((t_generator *)this,out);
        poVar5 = std::operator<<(poVar5,"this.");
        poVar5 = std::operator<<(poVar5,(string *)&(*pptVar7)->name_);
        poVar5 = std::operator<<(poVar5," = ");
        poVar5 = std::operator<<(poVar5,(string *)&(*pptVar7)->name_);
        poVar5 = std::operator<<(poVar5,";");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        generate_isset_set(this,out,*pptVar7);
      }
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"}");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  }
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"/**");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5," * Performs a deep copy on <i>other</i>.");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5," */");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"public ");
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_02,iVar3));
  poVar5 = std::operator<<(poVar5,"(");
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_03,iVar3));
  poVar5 = std::operator<<(poVar5," other) {");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  bVar2 = has_bit_vector(this,tstruct);
  if (bVar2) {
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,
                             "System.arraycopy(other.__isset_vector, 0, __isset_vector, 0, other.__isset_vector.length);"
                            );
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  }
  for (pptVar7 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar7 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar7 = pptVar7 + 1) {
    ptVar8 = *pptVar7;
    std::__cxx11::string::string((string *)&field_name,(string *)&ptVar8->name_);
    ptVar6 = ptVar8->type_;
    bVar2 = type_can_be_null(this,ptVar6);
    if (bVar2) {
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,"if (other.");
      generate_isset_check_abi_cxx11_(&local_110,this,ptVar8);
      poVar5 = std::operator<<(poVar5,(string *)&local_110);
      poVar5 = std::operator<<(poVar5,") {");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_110);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
    }
    iVar3 = (*(ptVar6->super_t_doc)._vptr_t_doc[0xd])(ptVar6);
    if ((char)iVar3 == '\0') {
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,"this.");
      poVar5 = std::operator<<(poVar5,(string *)&field_name);
      std::operator<<(poVar5," = ");
      std::operator+(&local_f0,"other.",&field_name);
      std::__cxx11::string::string((string *)&local_90,(string *)&field_name);
      generate_deep_copy_non_container(this,out,&local_f0,&local_90,ptVar6);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_f0);
      poVar5 = out;
    }
    else {
      std::__cxx11::string::string((string *)&local_b0,"other",(allocator *)&local_110);
      std::__cxx11::string::string((string *)&local_d0,(string *)&field_name);
      std::operator+(&local_70,"__this__",&field_name);
      generate_deep_copy_container(this,out,&local_b0,&local_d0,&local_70,ptVar6);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,"this.");
      poVar5 = std::operator<<(poVar5,(string *)&field_name);
      poVar5 = std::operator<<(poVar5," = __this__");
      poVar5 = std::operator<<(poVar5,(string *)&field_name);
    }
    poVar5 = std::operator<<(poVar5,";");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    if (bVar2) {
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,"}");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    }
    std::__cxx11::string::~string((string *)&field_name);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"public ");
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_04,iVar3));
  poVar5 = std::operator<<(poVar5," deepCopy() {");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"  return new ");
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_05,iVar3));
  poVar5 = std::operator<<(poVar5,"(this);");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  generate_java_struct_clear(this,out,tstruct);
  poVar5 = out;
  generate_java_bean_boilerplate(this,out,tstruct);
  generate_generic_field_getters_setters(this,poVar5,tstruct);
  generate_java_struct_equality(this,out,tstruct);
  generate_java_struct_compare_to(this,out,tstruct);
  generate_java_struct_reader(this,out,tstruct);
  if (is_result) {
    generate_java_struct_result_writer(this,out,tstruct);
  }
  else {
    generate_java_struct_writer(this,out,tstruct);
  }
  generate_java_struct_tostring(this,out,tstruct);
  generate_java_validator(this,out,tstruct);
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_javame_generator::generate_java_struct_definition(ostream& out,
                                                         t_struct* tstruct,
                                                         bool is_exception,
                                                         bool in_class,
                                                         bool is_result) {
  generate_java_doc(out, tstruct);

  bool is_final = (tstruct->annotations_.find("final") != tstruct->annotations_.end());

  indent(out) << "public " << (is_final ? "final " : "") << (in_class ? "static " : "") << "class "
              << tstruct->get_name() << " ";

  if (is_exception) {
    out << "extends Exception ";
  }
  out << "implements TBase ";

  scope_up(out);

  generate_struct_desc(out, tstruct);

  // Members are public for -java, private for -javabean
  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;

  out << endl;

  generate_field_descs(out, tstruct);

  out << endl;

  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    indent(out) << "private ";
    out << declare_field(*m_iter, false) << endl;
  }

  // isset data
  if (members.size() > 0) {
    out << endl;

    indent(out) << "// isset id assignments" << endl;

    int i = 0;
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      if (!type_can_be_null((*m_iter)->get_type())) {
        indent(out) << "private static final int " << isset_field_id(*m_iter) << " = " << i << ";"
                    << endl;
        i++;
      }
    }

    if (i > 0) {
      indent(out) << "private boolean[] __isset_vector = new boolean[" << i << "];" << endl;
    }

    out << endl;
  }

  bool all_optional_members = true;

  // Default constructor
  indent(out) << "public " << tstruct->get_name() << "() {" << endl;
  indent_up();
  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    t_type* t = get_true_type((*m_iter)->get_type());
    if ((*m_iter)->get_value() != nullptr) {
      print_const_value(out,
                        "this." + (*m_iter)->get_name(),
                        t,
                        (*m_iter)->get_value(),
                        true,
                        true);
    }
    if ((*m_iter)->get_req() != t_field::T_OPTIONAL) {
      all_optional_members = false;
    }
  }
  indent_down();
  indent(out) << "}" << endl << endl;

  if (!members.empty() && !all_optional_members) {
    // Full constructor for all fields
    indent(out) << "public " << tstruct->get_name() << "(" << endl;
    indent_up();
    bool first = true;
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      if ((*m_iter)->get_req() != t_field::T_OPTIONAL) {
        if (!first) {
          out << "," << endl;
        }
        first = false;
        indent(out) << type_name((*m_iter)->get_type()) << " " << (*m_iter)->get_name();
      }
    }
    out << ")" << endl;
    indent_down();
    indent(out) << "{" << endl;
    indent_up();
    indent(out) << "this();" << endl;
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      if ((*m_iter)->get_req() != t_field::T_OPTIONAL) {
        indent(out) << "this." << (*m_iter)->get_name() << " = " << (*m_iter)->get_name() << ";"
                    << endl;
        generate_isset_set(out, (*m_iter));
      }
    }
    indent_down();
    indent(out) << "}" << endl << endl;
  }

  // copy constructor
  indent(out) << "/**" << endl;
  indent(out) << " * Performs a deep copy on <i>other</i>." << endl;
  indent(out) << " */" << endl;
  indent(out) << "public " << tstruct->get_name() << "(" << tstruct->get_name() << " other) {"
              << endl;
  indent_up();

  if (has_bit_vector(tstruct)) {
    indent(out) << "System.arraycopy(other.__isset_vector, 0, __isset_vector, 0, "
                   "other.__isset_vector.length);" << endl;
  }

  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    t_field* field = (*m_iter);
    std::string field_name = field->get_name();
    t_type* type = field->get_type();
    bool can_be_null = type_can_be_null(type);

    if (can_be_null) {
      indent(out) << "if (other." << generate_isset_check(field) << ") {" << endl;
      indent_up();
    }

    if (type->is_container()) {
      generate_deep_copy_container(out, "other", field_name, "__this__" + field_name, type);
      indent(out) << "this." << field_name << " = __this__" << field_name << ";" << endl;
    } else {
      indent(out) << "this." << field_name << " = ";
      generate_deep_copy_non_container(out, "other." + field_name, field_name, type);
      out << ";" << endl;
    }

    if (can_be_null) {
      indent_down();
      indent(out) << "}" << endl;
    }
  }

  indent_down();
  indent(out) << "}" << endl << endl;

  // clone method, so that you can deep copy an object when you don't know its class.
  indent(out) << "public " << tstruct->get_name() << " deepCopy() {" << endl;
  indent(out) << "  return new " << tstruct->get_name() << "(this);" << endl;
  indent(out) << "}" << endl << endl;

  generate_java_struct_clear(out, tstruct);

  generate_java_bean_boilerplate(out, tstruct);
  generate_generic_field_getters_setters(out, tstruct);

  generate_java_struct_equality(out, tstruct);
  generate_java_struct_compare_to(out, tstruct);

  generate_java_struct_reader(out, tstruct);
  if (is_result) {
    generate_java_struct_result_writer(out, tstruct);
  } else {
    generate_java_struct_writer(out, tstruct);
  }
  generate_java_struct_tostring(out, tstruct);
  generate_java_validator(out, tstruct);
  scope_down(out);
  out << endl;
}